

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase238::run(TestCase238 *this)

{
  PromiseNode *pPVar1;
  long *plVar2;
  short *psVar3;
  undefined8 uVar4;
  __pid_t _Var5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *ptrCopy;
  bool bVar6;
  char buf [4];
  PipeThread pipeThread;
  AsyncIoContext ioContext;
  char local_204 [4];
  Own<kj::_::PromiseNode> local_200;
  uint local_1ec;
  undefined8 *local_1e8;
  long *local_1e0;
  undefined8 *local_1d8;
  long local_1d0;
  undefined8 *local_1c8;
  long *local_1c0;
  undefined8 *local_1b8;
  long *local_1b0;
  undefined8 *local_1a8;
  long *local_1a0;
  WaitScope *local_198;
  short *local_188;
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 aStack_180;
  char local_28;
  
  setupAsyncIo();
  plVar2 = local_1a0;
  local_1e0 = (long *)operator_new(0x10);
  *local_1e0 = (long)&PTR_operator___00439218;
  local_1e8 = &_::
               HeapDisposer<kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>::Impl<kj::(anonymous_namespace)::TestCase238::run()::$_0>>
               ::instance;
  (**(code **)(*plVar2 + 0x20))(&local_1d8,plVar2);
  plVar2 = local_1e0;
  if (local_1e0 != (long *)0x0) {
    local_1e0 = (long *)0x0;
    (**(code **)*local_1e8)(local_1e8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  (**(code **)local_1c0[1])(&local_200,local_1c0 + 1,"bar",3);
  local_188 = (short *)((ulong)local_188 & 0xffffffffffffff00);
  local_28 = '\0';
  _::waitImpl(&local_200,(ExceptionOrValue *)&local_188,local_198);
  if (local_28 == '\x01') {
    if (local_188._0_1_ != false) {
      throwRecoverableException((Exception *)&aStack_180,0);
    }
  }
  else {
    if (local_188._0_1_ == false) {
      _::unreachable();
    }
    throwRecoverableException((Exception *)&aStack_180,0);
  }
  if (local_188._0_1_ == true) {
    Exception::~Exception((Exception *)&aStack_180);
  }
  pPVar1 = local_200.ptr;
  if (local_200.ptr != (PromiseNode *)0x0) {
    local_200.ptr = (PromiseNode *)0x0;
    (**(local_200.disposer)->_vptr_Disposer)
              (local_200.disposer,
               (_func_int *)((long)&pPVar1->_vptr_PromiseNode + (long)pPVar1->_vptr_PromiseNode[-2])
              );
  }
  (**(code **)(*local_1c0 + 8))((ExceptionOrValue *)&local_188,local_1c0,local_204,3,4);
  _Var5 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_188,local_198);
  uVar4 = aStack_180.value.ownFile.content.ptr;
  if ((long *)aStack_180.value.ownFile.content.ptr != (long *)0x0) {
    aStack_180.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_188)
              (local_188,(char *)(uVar4 + *(long *)(*(long *)uVar4 + -0x10)));
  }
  if ((CONCAT44(extraout_var,_Var5) != 3) && (_::Debug::minSeverity < 3)) {
    local_1ec = 3;
    (**(code **)(*local_1c0 + 8))((ExceptionOrValue *)&local_188,local_1c0,local_204,3,4);
    _Var5 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_188,local_198);
    local_200.disposer = (Disposer *)CONCAT44(extraout_var_00,_Var5);
    _::Debug::log<char_const(&)[89],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0xfe,ERROR,
               "\"failed: expected \" \"(3u) == (pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope))\", 3u, pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope)"
               ,(char (*) [89])
                "failed: expected (3u) == (pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope))"
               ,&local_1ec,(unsigned_long *)&local_200);
    uVar4 = aStack_180.value.ownFile.content.ptr;
    if ((long *)aStack_180.value.ownFile.content.ptr != (long *)0x0) {
      aStack_180.value.ownFile.content.ptr = (char *)0x0;
      (*(code *)**(undefined8 **)local_188)
                (local_188,(char *)(uVar4 + *(long *)(*(long *)uVar4 + -0x10)));
    }
  }
  heapString((String *)&local_188,local_204,3);
  uVar4 = aStack_180.value.ownFile.content.ptr;
  psVar3 = local_188;
  bVar6 = true;
  if ((long *)aStack_180.value.ownFile.content.ptr == (long *)0x4) {
    bVar6 = (char)local_188[1] != 'o' || *local_188 != 0x6f66;
  }
  if (local_188 != (short *)0x0) {
    local_188 = (short *)0x0;
    aStack_180.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)aStack_180.value.ownFile.content.size_)
              (aStack_180.value.ownFile.content.size_,psVar3,1,uVar4,uVar4,0);
  }
  if ((bool)(bVar6 & _::Debug::minSeverity < 3)) {
    heapString((String *)&local_188,local_204,3);
    _::Debug::log<char_const(&)[49],char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0xff,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (heapString(buf, 3))\", \"foo\", heapString(buf, 3)"
               ,(char (*) [49])"failed: expected (\"foo\") == (heapString(buf, 3))",
               (char (*) [4])0x38b288,(String *)&local_188);
    uVar4 = aStack_180.value.ownFile.content.ptr;
    psVar3 = local_188;
    if (local_188 != (short *)0x0) {
      local_188 = (short *)0x0;
      aStack_180.value.ownFile.content.ptr = (char *)0x0;
      (*(code *)**(undefined8 **)aStack_180.value.ownFile.content.size_)
                (aStack_180.value.ownFile.content.size_,psVar3,1,uVar4,uVar4,0);
    }
  }
  plVar2 = local_1c0;
  if (local_1c0 != (long *)0x0) {
    local_1c0 = (long *)0x0;
    (**(code **)*local_1c8)(local_1c8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  if (local_1d0 != 0) {
    local_1d0 = 0;
    (**(code **)*local_1d8)();
  }
  plVar2 = local_1a0;
  if (local_1a0 != (long *)0x0) {
    local_1a0 = (long *)0x0;
    (**(code **)*local_1a8)(local_1a8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  plVar2 = local_1b0;
  if (local_1b0 != (long *)0x0) {
    local_1b0 = (long *)0x0;
    (**(code **)*local_1b8)(local_1b8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  return;
}

Assistant:

TEST(AsyncIo, PipeThread) {
  auto ioContext = setupAsyncIo();

  auto pipeThread = ioContext.provider->newPipeThread(
      [](AsyncIoProvider& ioProvider, AsyncIoStream& stream, WaitScope& waitScope) {
    char buf[4];
    stream.write("foo", 3).wait(waitScope);
    EXPECT_EQ(3u, stream.tryRead(buf, 3, 4).wait(waitScope));
    EXPECT_EQ("bar", heapString(buf, 3));

    // Expect disconnect.
    EXPECT_EQ(0, stream.tryRead(buf, 1, 1).wait(waitScope));
  });

  char buf[4];
  pipeThread.pipe->write("bar", 3).wait(ioContext.waitScope);
  EXPECT_EQ(3u, pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope));
  EXPECT_EQ("foo", heapString(buf, 3));
}